

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDImporter.cpp
# Opt level: O3

void __thiscall
Assimp::MMDImporter::CreateDataFromImport(MMDImporter *this,PmxModel *pModel,aiScene *pScene)

{
  undefined8 *puVar1;
  ProgressHandler *pPVar2;
  ProgressHandler **ppPVar3;
  ProgressHandler **ppPVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  uint uVar11;
  int indexCount;
  size_t __n;
  pointer pcVar12;
  SharedPostProcessInfo *__n_00;
  PmxMaterial *pPVar13;
  ulong __n_01;
  PmxBone *pPVar14;
  PmxBone *pPVar15;
  aiNode *paVar16;
  undefined8 *puVar17;
  uint *puVar18;
  ulong uVar19;
  aiMesh **ppaVar20;
  aiMesh *paVar21;
  aiNode **ppaVar22;
  long lVar23;
  aiMaterial **ppaVar24;
  aiMaterial *paVar25;
  int iVar26;
  ProgressHandler *pPVar27;
  MMDImporter *pMVar28;
  aiNode **children;
  long lVar29;
  long lVar30;
  aiNode *pNode;
  MakeLeftHandedProcess convertProcess;
  FlipWindingOrderProcess windingFlipper;
  FlipUVsProcess uvFlipper;
  aiNode *local_98;
  MakeLeftHandedProcess local_90;
  undefined8 uStack_78;
  FlipWindingOrderProcess local_70;
  FlipUVsProcess local_50;
  
  if (pModel == (PmxModel *)0x0) {
    return;
  }
  paVar16 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar16);
  __n = (pModel->model_name)._M_string_length;
  local_98 = paVar16;
  if (0xfffffffffffffc00 < __n - 0x400) {
    (paVar16->mName).length = (ai_uint32)__n;
    memcpy((paVar16->mName).data,(pModel->model_name)._M_dataplus._M_p,__n);
    (paVar16->mName).data[__n] = '\0';
  }
  pScene->mRootNode = paVar16;
  paVar16 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar16);
  local_98 = paVar16;
  aiNode::addChildren(pScene->mRootNode,1,&local_98);
  paVar16 = local_98;
  ppPVar3 = &local_50.super_BaseProcess.progress;
  pcVar12 = (pModel->model_name)._M_dataplus._M_p;
  local_50.super_BaseProcess._vptr_BaseProcess = (_func_int **)ppPVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar12,pcVar12 + (pModel->model_name)._M_string_length);
  ppPVar4 = &local_70.super_BaseProcess.progress;
  local_70.super_BaseProcess._vptr_BaseProcess = (_func_int **)ppPVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"_mesh","");
  pPVar2 = (ProgressHandler *)
           (&((local_70.super_BaseProcess.shared)->pmap)._M_t._M_impl.field_0x0 +
           (long)&((local_50.super_BaseProcess.shared)->pmap)._M_t._M_impl.field_0x0);
  pPVar27 = (ProgressHandler *)0xf;
  if ((ProgressHandler **)local_50.super_BaseProcess._vptr_BaseProcess != ppPVar3) {
    pPVar27 = local_50.super_BaseProcess.progress;
  }
  if (pPVar27 < pPVar2) {
    pPVar27 = (ProgressHandler *)0xf;
    if ((ProgressHandler **)local_70.super_BaseProcess._vptr_BaseProcess != ppPVar4) {
      pPVar27 = local_70.super_BaseProcess.progress;
    }
    if (pPVar2 <= pPVar27) {
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_70,0,(char *)0x0,
                           (ulong)local_50.super_BaseProcess._vptr_BaseProcess);
      goto LAB_00667f0a;
    }
  }
  puVar17 = (undefined8 *)
            std::__cxx11::string::_M_append
                      ((char *)&local_50,(ulong)local_70.super_BaseProcess._vptr_BaseProcess);
LAB_00667f0a:
  local_90.super_BaseProcess._vptr_BaseProcess = (_func_int **)&local_90.super_BaseProcess.progress;
  puVar1 = puVar17 + 2;
  if ((ProgressHandler **)*puVar17 == (ProgressHandler **)puVar1) {
    local_90.super_BaseProcess.progress = (ProgressHandler *)*puVar1;
    uStack_78 = puVar17[3];
  }
  else {
    local_90.super_BaseProcess.progress = (ProgressHandler *)*puVar1;
    local_90.super_BaseProcess._vptr_BaseProcess = (_func_int **)*puVar17;
  }
  __n_00 = (SharedPostProcessInfo *)puVar17[1];
  *puVar17 = puVar1;
  puVar17[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_90.super_BaseProcess.shared = __n_00;
  if (__n_00 < (SharedPostProcessInfo *)&DAT_00000400) {
    (paVar16->mName).length = (ai_uint32)__n_00;
    memcpy((paVar16->mName).data,local_90.super_BaseProcess._vptr_BaseProcess,(size_t)__n_00);
    (paVar16->mName).data[(long)__n_00] = '\0';
  }
  if ((ProgressHandler **)local_90.super_BaseProcess._vptr_BaseProcess !=
      &local_90.super_BaseProcess.progress) {
    operator_delete(local_90.super_BaseProcess._vptr_BaseProcess);
  }
  if ((ProgressHandler **)local_70.super_BaseProcess._vptr_BaseProcess != ppPVar4) {
    operator_delete(local_70.super_BaseProcess._vptr_BaseProcess);
  }
  if ((ProgressHandler **)local_50.super_BaseProcess._vptr_BaseProcess != ppPVar3) {
    operator_delete(local_50.super_BaseProcess._vptr_BaseProcess);
  }
  paVar16 = local_98;
  uVar11 = pModel->material_count;
  local_98->mNumMeshes = uVar11;
  puVar18 = (uint *)operator_new__((ulong)uVar11 << 2);
  paVar16->mMeshes = puVar18;
  if (paVar16->mNumMeshes != 0) {
    uVar19 = 0;
    do {
      paVar16->mMeshes[uVar19] = (uint)uVar19;
      uVar19 = uVar19 + 1;
      paVar16 = local_98;
    } while (uVar19 < local_98->mNumMeshes);
  }
  uVar11 = pModel->material_count;
  pScene->mNumMeshes = uVar11;
  pMVar28 = (MMDImporter *)((ulong)uVar11 * 8);
  ppaVar20 = (aiMesh **)operator_new__((ulong)pMVar28);
  pScene->mMeshes = ppaVar20;
  if ((ulong)uVar11 != 0) {
    lVar29 = 0;
    uVar19 = 0;
    iVar26 = 0;
    do {
      indexCount = *(int *)((long)((pModel->materials)._M_t.
                                   super___uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>
                                   .super__Head_base<0UL,_pmx::PmxMaterial_*,_false>._M_head_impl)->
                                  edge_color + lVar29 + 0x48U);
      paVar21 = CreateMesh(pMVar28,pModel,iVar26,indexCount);
      pScene->mMeshes[uVar19] = paVar21;
      pPVar13 = (pModel->materials)._M_t.
                super___uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>.
                _M_t.
                super__Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>
                .super__Head_base<0UL,_pmx::PmxMaterial_*,_false>._M_head_impl;
      __n_01 = *(ulong *)((long)pPVar13->diffuse + lVar29 + 0xffffffffffffffc8U);
      if (__n_01 < 0x400) {
        paVar21 = pScene->mMeshes[uVar19];
        (paVar21->mName).length = (ai_uint32)__n_01;
        pMVar28 = (MMDImporter *)(paVar21->mName).data;
        memcpy(pMVar28,*(void **)((long)pPVar13->diffuse + lVar29 + -0x40),__n_01);
        (paVar21->mName).data[__n_01] = '\0';
      }
      pScene->mMeshes[uVar19]->mMaterialIndex = (uint)uVar19;
      iVar26 = iVar26 + indexCount;
      uVar19 = uVar19 + 1;
      lVar29 = lVar29 + 0xc0;
    } while (uVar19 < pScene->mNumMeshes);
  }
  lVar29 = (long)pModel->bone_count;
  uVar19 = 0xffffffffffffffff;
  if (-1 < lVar29) {
    uVar19 = lVar29 * 8;
  }
  ppaVar22 = (aiNode **)operator_new__(uVar19);
  if (0 < lVar29) {
    lVar29 = 0;
    lVar30 = 0;
    do {
      paVar16 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar16,(string *)
                             ((long)((pModel->bones)._M_t.
                                     super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>
                                     .super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl)->
                                    position + lVar29 + -0x40));
      ppaVar22[lVar30] = paVar16;
      lVar30 = lVar30 + 1;
      lVar29 = lVar29 + 0xb0;
    } while (lVar30 < pModel->bone_count);
    if (0 < pModel->bone_count) {
      lVar30 = 0x4c;
      lVar29 = 0;
      children = ppaVar22;
      do {
        pPVar14 = (pModel->bones)._M_t.
                  super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>._M_t.
                  super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>.
                  super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl;
        lVar23 = (long)*(int *)((long)pPVar14->position + lVar30 + -0x40);
        if (lVar23 < 0) {
          aiNode::addChildren(pScene->mRootNode,1,children);
        }
        else {
          aiNode::addChildren(ppaVar22[lVar23],1,children);
          iVar26 = *(int *)((long)pPVar14->position + lVar30 + -0x40);
          pPVar15 = (pModel->bones)._M_t.
                    super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>._M_t.
                    super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>.
                    super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl;
          fVar5 = *(float *)((long)pPVar14->position + lVar30 + 0xffffffffffffffb4U);
          fVar6 = *(float *)((long)pPVar14->position + lVar30 + 0xffffffffffffffb8U);
          fVar7 = pPVar15[iVar26].position[0];
          fVar8 = pPVar15[iVar26].position[1];
          fVar9 = *(float *)((long)pPVar14->position + lVar30 + 0xffffffffffffffbcU);
          fVar10 = pPVar15[iVar26].position[2];
          paVar16 = *children;
          (paVar16->mTransformation).a1 = 1.0;
          (paVar16->mTransformation).a2 = 0.0;
          (paVar16->mTransformation).a3 = 0.0;
          (paVar16->mTransformation).a4 = 0.0;
          (paVar16->mTransformation).b1 = 0.0;
          (paVar16->mTransformation).b2 = 1.0;
          (paVar16->mTransformation).b3 = 0.0;
          (paVar16->mTransformation).b4 = 0.0;
          (paVar16->mTransformation).c1 = 0.0;
          (paVar16->mTransformation).c2 = 0.0;
          (paVar16->mTransformation).c3 = 1.0;
          (paVar16->mTransformation).d3 = 0.0;
          (paVar16->mTransformation).d4 = 1.0;
          (paVar16->mTransformation).d1 = 0.0;
          (paVar16->mTransformation).d2 = 0.0;
          (paVar16->mTransformation).a4 = fVar5 - fVar7;
          (paVar16->mTransformation).b4 = fVar6 - fVar8;
          (paVar16->mTransformation).c4 = fVar9 - fVar10;
        }
        lVar29 = lVar29 + 1;
        children = children + 1;
        lVar30 = lVar30 + 0xb0;
      } while (lVar29 < pModel->bone_count);
    }
  }
  uVar11 = pModel->material_count;
  pScene->mNumMaterials = uVar11;
  pMVar28 = (MMDImporter *)((ulong)uVar11 << 3);
  ppaVar24 = (aiMaterial **)operator_new__((ulong)pMVar28);
  pScene->mMaterials = ppaVar24;
  if (uVar11 != 0) {
    lVar29 = 0;
    uVar19 = 0;
    do {
      paVar25 = CreateMaterial(pMVar28,(PmxMaterial *)
                                       ((long)((pModel->materials)._M_t.
                                               super___uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>
                                               .super__Head_base<0UL,_pmx::PmxMaterial_*,_false>.
                                              _M_head_impl)->diffuse + lVar29 + -0x40),pModel);
      pScene->mMaterials[uVar19] = paVar25;
      uVar19 = uVar19 + 1;
      lVar29 = lVar29 + 0xc0;
    } while (uVar19 < pScene->mNumMaterials);
  }
  MakeLeftHandedProcess::MakeLeftHandedProcess(&local_90);
  MakeLeftHandedProcess::Execute(&local_90,pScene);
  FlipUVsProcess::FlipUVsProcess(&local_50);
  FlipUVsProcess::Execute(&local_50,pScene);
  FlipWindingOrderProcess::FlipWindingOrderProcess(&local_70);
  FlipWindingOrderProcess::Execute(&local_70,pScene);
  FlipWindingOrderProcess::~FlipWindingOrderProcess(&local_70);
  FlipUVsProcess::~FlipUVsProcess(&local_50);
  MakeLeftHandedProcess::~MakeLeftHandedProcess(&local_90);
  operator_delete__(ppaVar22);
  return;
}

Assistant:

void MMDImporter::CreateDataFromImport(const pmx::PmxModel *pModel,
                                       aiScene *pScene) {
  if (pModel == NULL) {
    return;
  }

  aiNode *pNode = new aiNode;
  if (!pModel->model_name.empty()) {
    pNode->mName.Set(pModel->model_name);
  }

  pScene->mRootNode = pNode;

  pNode = new aiNode;
  pScene->mRootNode->addChildren(1, &pNode);
  pNode->mName.Set(string(pModel->model_name) + string("_mesh"));

  // split mesh by materials
  pNode->mNumMeshes = pModel->material_count;
  pNode->mMeshes = new unsigned int[pNode->mNumMeshes];
  for (unsigned int index = 0; index < pNode->mNumMeshes; index++) {
    pNode->mMeshes[index] = index;
  }

  pScene->mNumMeshes = pModel->material_count;
  pScene->mMeshes = new aiMesh *[pScene->mNumMeshes];
  for (unsigned int i = 0, indexStart = 0; i < pScene->mNumMeshes; i++) {
    const int indexCount = pModel->materials[i].index_count;

    pScene->mMeshes[i] = CreateMesh(pModel, indexStart, indexCount);
    pScene->mMeshes[i]->mName = pModel->materials[i].material_name;
    pScene->mMeshes[i]->mMaterialIndex = i;
    indexStart += indexCount;
  }

  // create node hierarchy for bone position
  std::unique_ptr<aiNode *[]> ppNode(new aiNode *[pModel->bone_count]);
  for (auto i = 0; i < pModel->bone_count; i++) {
    ppNode[i] = new aiNode(pModel->bones[i].bone_name);
  }

  for (auto i = 0; i < pModel->bone_count; i++) {
    const pmx::PmxBone &bone = pModel->bones[i];

    if (bone.parent_index < 0) {
      pScene->mRootNode->addChildren(1, ppNode.get() + i);
    } else {
      ppNode[bone.parent_index]->addChildren(1, ppNode.get() + i);

      aiVector3D v3 = aiVector3D(
          bone.position[0] - pModel->bones[bone.parent_index].position[0],
          bone.position[1] - pModel->bones[bone.parent_index].position[1],
          bone.position[2] - pModel->bones[bone.parent_index].position[2]);
      aiMatrix4x4::Translation(v3, ppNode[i]->mTransformation);
    }
  }

  // create materials
  pScene->mNumMaterials = pModel->material_count;
  pScene->mMaterials = new aiMaterial *[pScene->mNumMaterials];
  for (unsigned int i = 0; i < pScene->mNumMaterials; i++) {
    pScene->mMaterials[i] = CreateMaterial(&pModel->materials[i], pModel);
  }

  // Convert everything to OpenGL space
  MakeLeftHandedProcess convertProcess;
  convertProcess.Execute(pScene);

  FlipUVsProcess uvFlipper;
  uvFlipper.Execute(pScene);

  FlipWindingOrderProcess windingFlipper;
  windingFlipper.Execute(pScene);
}